

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Long PVG_FT_DivFix(PVG_FT_Long a,PVG_FT_Long b)

{
  undefined8 local_38;
  undefined8 local_30;
  PVG_FT_Long q;
  ulong uStack_18;
  PVG_FT_Int s;
  PVG_FT_Long b_local;
  PVG_FT_Long a_local;
  
  q._4_4_ = 1;
  b_local = a;
  if (a < 0) {
    b_local = -a;
    q._4_4_ = -1;
  }
  uStack_18 = b;
  if (b < 0) {
    uStack_18 = -b;
    q._4_4_ = -q._4_4_;
  }
  if ((long)uStack_18 < 1) {
    local_30 = 0x7fffffff;
  }
  else {
    local_30 = (ulong)(b_local * 0x10000 + ((long)uStack_18 >> 1)) / uStack_18;
  }
  if (q._4_4_ < 0) {
    local_38 = -local_30;
  }
  else {
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

PVG_FT_Long PVG_FT_DivFix(PVG_FT_Long a, PVG_FT_Long b)
{
    PVG_FT_Int  s = 1;
    PVG_FT_Long q;

    PVG_FT_MOVE_SIGN(a, s);
    PVG_FT_MOVE_SIGN(b, s);

    q = (PVG_FT_Long)(b > 0 ? (((PVG_FT_UInt64)a << 16) + (b >> 1)) / b
                           : 0x7FFFFFFFL);

    return (s < 0 ? -q : q);
}